

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateMembers
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  long lVar1;
  LogMessage *other;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  variables = &(this->super_ImmutableEnumFieldGenerator).variables_;
  PrintExtraFieldInfo(variables,printer);
  pFVar3 = (this->super_ImmutableEnumFieldGenerator).descriptor_;
  if (((~(byte)pFVar3[1] & 0x60) == 0) ||
     ((((pDVar2 = FieldDescriptor::message_type(pFVar3), pDVar2 == (Descriptor *)0x0 &&
        (((byte)pFVar3[1] & 2) == 0)) && (*(char *)(*(long *)(pFVar3 + 0x10) + 0x3a) != '\x02')) &&
      ((lVar1 = *(long *)(pFVar3 + 0x28), lVar1 == 0 || ((byte)pFVar3[1] & 0x10) == 0 ||
       ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))))))) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_enum_field.cc"
               ,0x1ad);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: HasHazzer(descriptor_): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableEnumFieldGenerator).descriptor_,HAZZER,false);
  io::Printer::Print(printer,variables,
                     "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableEnumFieldGenerator).descriptor_);
  pFVar3 = (this->super_ImmutableEnumFieldGenerator).descriptor_;
  if (*(char *)(*(long *)(pFVar3 + 0x10) + 0x3a) == '\x03') {
    WriteFieldEnumValueAccessorDocComment(printer,pFVar3,GETTER,false);
    io::Printer::Print(printer,variables,
                       "$deprecation$public int ${$get$capitalized_name$Value$}$() {\n  if ($has_oneof_case_message$) {\n    return (java.lang.Integer) $oneof_name$_;\n  }\n  return $default_number$;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,"{","}",(this->super_ImmutableEnumFieldGenerator).descriptor_);
    pFVar3 = (this->super_ImmutableEnumFieldGenerator).descriptor_;
  }
  WriteFieldAccessorDocComment(printer,pFVar3,GETTER,false);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    @SuppressWarnings(\"deprecation\")\n    $type$ result = $type$.$for_number$(\n        (java.lang.Integer) $oneof_name$_);\n    return result == null ? $unknown$ : result;\n  }\n  return $default$;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableEnumFieldGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  GOOGLE_DCHECK(HasHazzer(descriptor_));
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
  printer->Print(variables_,
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, GETTER);
    printer->Print(
        variables_,
        "$deprecation$public int ${$get$capitalized_name$Value$}$() {\n"
        "  if ($has_oneof_case_message$) {\n"
        "    return (java.lang.Integer) $oneof_name$_;\n"
        "  }\n"
        "  return $default_number$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    @SuppressWarnings(\"deprecation\")\n"
                 "    $type$ result = $type$.$for_number$(\n"
                 "        (java.lang.Integer) $oneof_name$_);\n"
                 "    return result == null ? $unknown$ : result;\n"
                 "  }\n"
                 "  return $default$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
}